

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O3

void __thiscall soplex::DataArray<bool>::DataArray(DataArray<bool> *this,DataArray<bool> *old)

{
  int n;
  
  this->thesize = old->thesize;
  n = old->themax;
  this->themax = n;
  this->data = (bool *)0x0;
  this->memFactor = old->memFactor;
  spx_alloc<bool*>(&this->data,n);
  if ((ulong)(uint)this->thesize != 0) {
    memcpy(this->data,old->data,(ulong)(uint)this->thesize);
    return;
  }
  return;
}

Assistant:

DataArray(const DataArray& old)
      : thesize(old.thesize)
      , themax(old.themax)
      , data(nullptr)
      , memFactor(old.memFactor)
   {
      spx_alloc(data, max());

      assert(thesize >= 0);

      if(thesize)
         memcpy(data, old.data, (unsigned int)thesize * sizeof(T));

      assert(isConsistent());
   }